

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O3

int __thiscall HttpConn::init(HttpConn *this,EVP_PKEY_CTX *ctx)

{
  element_type *peVar1;
  EventLoop *this_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int in_ECX;
  string *in_RDX;
  ChannelPtr local_38;
  
  this->connStatus_ = Connected;
  this->fd_ = in_ECX;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->outputHeaders_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers_)._M_t);
  peVar1 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->loop_ = (EventLoop *)ctx;
  peVar1->fd_ = in_ECX;
  this->loop_ = (EventLoop *)ctx;
  *(int *)(ctx + 0x98) = *(int *)(ctx + 0x98) + 1;
  std::__cxx11::string::operator=((string *)&this->from_,in_RDX);
  local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ = -0x7ffffffb;
  this_00 = this->loop_;
  local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  EventLoop::addChannel(this_00,&local_38);
  iVar2 = extraout_EAX;
  if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void HttpConn::init(EventLoop* loop, std::string from, int fd) {
    connStatus_ = Connected;
    fd_ = fd;
    outputHeaders_.clear();
    headers_.clear();
    channel_->reset(loop, fd);
    loop_ = loop;
    loop_->addConnCnt();
    from_ = std::move(from);
    channel_->setEvent(defautlEvent);
    loop_->addChannel(channel_);
}